

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

FACTRPC * FACT_INTERNAL_GetRPC(FACTAudioEngine *engine,uint32_t code)

{
  code *pcVar1;
  int iVar2;
  FACTRPC *pFVar3;
  int in_ESI;
  long in_RDI;
  SDL_AssertState sdl_assert_state;
  uint16_t i;
  ushort local_16;
  
  for (local_16 = 0; local_16 < *(ushort *)(in_RDI + 0x24); local_16 = local_16 + 1) {
    if (*(int *)(*(long *)(in_RDI + 0x40) + (ulong)local_16 * 4) == in_ESI) {
      return (FACTRPC *)(*(long *)(in_RDI + 0x60) + (ulong)local_16 * 0x10);
    }
  }
  do {
    iVar2 = SDL_ReportAssertion(&FACT_INTERNAL_GetRPC::sdl_assert_data,"FACT_INTERNAL_GetRPC",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                ,0x3da);
  } while (iVar2 == 0);
  if (iVar2 != 1) {
    return (FACTRPC *)0x0;
  }
  pcVar1 = (code *)swi(3);
  pFVar3 = (FACTRPC *)(*pcVar1)();
  return pFVar3;
}

Assistant:

FACTRPC* FACT_INTERNAL_GetRPC(
	FACTAudioEngine *engine,
	uint32_t code
) {
	uint16_t i;
	for (i = 0; i < engine->rpcCount; i += 1)
	{
		if (engine->rpcCodes[i] == code)
		{
			return &engine->rpcs[i];
		}
	}

	FAudio_assert(0 && "RPC code not found!");
	return NULL;
}